

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O3

void __thiscall SQArray::Pop(SQArray *this)

{
  SQUnsignedInteger SVar1;
  
  SVar1 = (this->_values)._size - 1;
  (this->_values)._size = SVar1;
  SQObjectPtr::~SQObjectPtr((this->_values)._vals + SVar1);
  if ((this->_values)._allocated >> 2 < (this->_values)._size) {
    return;
  }
  sqvector<SQObjectPtr>::shrinktofit(&this->_values);
  return;
}

Assistant:

void Pop(){_values.pop_back(); ShrinkIfNeeded(); }